

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,uint8_t *index_reg,MemoryAccess access)

{
  _Any_data *this_00;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = &local_68;
  Pipeline::Pipeline(__return_storage_ptr__);
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1222:17)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1222:17)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1223:17)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1223:17)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  local_68._8_8_ = index_reg;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  if (access == Read) {
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1246:33)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1246:33)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    Pipeline::push_conditional(__return_storage_ptr__,(ConditionalStepT *)&local_48);
    this_00 = &local_48;
  }
  else if (access == Write) {
    local_68._8_8_ = (uint8_t *)0x0;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1233:21)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1233:21)>
               ::_M_manager;
    local_68._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_68);
    this_00 = &local_68;
  }
  else {
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1258:21)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1258:21)>
               ::_M_manager;
    local_68._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1270:21)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1270:21)>
               ::_M_manager;
    local_68._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
    local_68._8_8_ = (uint8_t *)0x0;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1274:21)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1274:21)>
               ::_M_manager;
    local_68._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_68);
  }
  std::_Function_base::~_Function_base((_Function_base *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_absolute_indexed_addressing_steps(
        const uint8_t *index_reg,
        const MemoryAccess access) {
    Pipeline result;
    result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
    result.push([this, index_reg] {
        const uint16_t address_high = mmu_->read_byte(registers_->pc++) << 8u;
        const uint16_t abs_address = address_high | tmp_;
        const uint8_t offset = *index_reg;

        is_crossing_page_boundary_ = cross_page(abs_address, offset);
        effective_address_ = abs_address + offset;
    });

    if (access == MemoryAccess::Write) {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
    } else if (access == MemoryAccess::Read) {
        result.push_conditional([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
                return StepResult::Continue;
            }
            return StepResult::Skip;
        });
    } else {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
        result.push([this] {
            // Extra read from effective address.
            tmp_ = mmu_->read_byte(effective_address_);
        });
        result.push([this] {
            // Extra write.
            mmu_->write_byte(effective_address_, tmp_);
        });
    }
    return result;
}